

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::scrollContentsBy(QTableView *this,int dx,int dy)

{
  bool bVar1;
  ScrollMode SVar2;
  int iVar3;
  QTableViewPrivate *pQVar4;
  QHeaderViewPrivate *this_00;
  int in_EDX;
  int in_ESI;
  int newOffset_1;
  int oldOffset_1;
  int newOffset;
  int oldOffset;
  QTableViewPrivate *d;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QWidget *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QHeaderViewPrivate *in_stack_ffffffffffffffa0;
  int local_4c;
  int local_34;
  int local_10;
  int local_c;
  
  pQVar4 = d_func((QTableView *)0x8b6dad);
  QBasicTimer::stop();
  bVar1 = QWidget::isRightToLeft((QWidget *)0x8b6dcd);
  local_34 = in_ESI;
  if (bVar1) {
    local_34 = -in_ESI;
  }
  local_c = local_34;
  if (local_34 != 0) {
    local_4c = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff80);
    QHeaderView::d_func((QHeaderView *)0x8b6e20);
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff80);
    QAbstractItemView::horizontalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff80);
    QHeaderViewPrivate::setScrollOffset
              (in_stack_ffffffffffffffa0,
               (QScrollBar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (ScrollMode)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    SVar2 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff80);
    if (SVar2 == ScrollPerItem) {
      iVar3 = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff80);
      bVar1 = QWidget::isRightToLeft((QWidget *)0x8b6e7d);
      if (bVar1) {
        local_4c = iVar3 - local_4c;
      }
      else {
        local_4c = local_4c - iVar3;
      }
      local_c = local_4c;
    }
  }
  local_10 = in_EDX;
  if (in_EDX != 0) {
    iVar3 = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff80);
    this_00 = QHeaderView::d_func((QHeaderView *)0x8b6ed8);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffff80);
    QAbstractItemView::verticalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff80);
    QHeaderViewPrivate::setScrollOffset
              (this_00,(QScrollBar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (ScrollMode)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    SVar2 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)in_stack_ffffffffffffff80);
    if (SVar2 == ScrollPerItem) {
      local_10 = QHeaderView::offset((QHeaderView *)in_stack_ffffffffffffff80);
      local_10 = iVar3 - local_10;
    }
  }
  QAbstractItemViewPrivate::scrollContentsBy
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  if ((pQVar4->showGrid & 1U) != 0) {
    if ((0 < local_10) && (bVar1 = QWidget::isHidden((QWidget *)0x8b6f75), bVar1)) {
      in_stack_ffffffffffffff90 =
           (pQVar4->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
      QWidget::width((QWidget *)0x8b6fa5);
      QWidget::update((QWidget *)CONCAT44(local_10,in_stack_ffffffffffffff98),
                      (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90
                      ,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff9c = local_10;
    }
    if ((0 < local_c) && (bVar1 = QWidget::isHidden((QWidget *)0x8b6fd4), bVar1)) {
      iVar3 = local_c;
      QWidget::height((QWidget *)0x8b700c);
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90
                      ,iVar3,local_c);
    }
  }
  return;
}

Assistant:

void QTableView::scrollContentsBy(int dx, int dy)
{
    Q_D(QTableView);

    d->delayedAutoScroll.stop(); // auto scroll was canceled by the user scrolling

    dx = isRightToLeft() ? -dx : dx;
    if (dx) {
        int oldOffset = d->horizontalHeader->offset();
        d->horizontalHeader->d_func()->setScrollOffset(horizontalScrollBar(), horizontalScrollMode());
        if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->horizontalHeader->offset();
            dx = isRightToLeft() ? newOffset - oldOffset : oldOffset - newOffset;
        }
    }
    if (dy) {
        int oldOffset = d->verticalHeader->offset();
        d->verticalHeader->d_func()->setScrollOffset(verticalScrollBar(), verticalScrollMode());
        if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->verticalHeader->offset();
            dy = oldOffset - newOffset;
        }
    }
    d->scrollContentsBy(dx, dy);

    if (d->showGrid) {
        //we need to update the first line of the previous top item in the view
        //because it has the grid drawn if the header is invisible.
        //It is strictly related to what's done at then end of the paintEvent
        if (dy > 0 && d->horizontalHeader->isHidden()) {
            d->viewport->update(0, dy, d->viewport->width(), dy);
        }
        if (dx > 0 && d->verticalHeader->isHidden()) {
            d->viewport->update(dx, 0, dx, d->viewport->height());
        }
    }
}